

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O3

void __thiscall OPN2::OPN2(OPN2 *this)

{
  list<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>,_std::allocator<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>_>_>
  *plVar1;
  Slot **p;
  
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = &(this->m_insBanks).m_allocations;
  (this->m_insBanks).m_buckets.
  super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
  .m_p = (Slot **)0x0;
  (this->m_insBanks).m_buckets.
  super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
  .m_counter = (size_t *)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_regLFOSetup = '\0';
  (this->m_insBanks).m_allocations.
  super__List_base<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>,_std::allocator<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_insBanks).m_allocations.
  super__List_base<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>,_std::allocator<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_insBanks).m_allocations.
  super__List_base<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>,_std::allocator<AdlMIDI_SPtrArray<BasicBankMap<OPN2::Bank>::Slot>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_insBanks).m_freeslots = (Slot *)0x0;
  (this->m_insBanks).m_size = 0;
  (this->m_insBanks).m_capacity = 0;
  p = (Slot **)operator_new__(0x800);
  memset(p,0,0x800);
  AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
  ::reset((AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
           *)&this->m_insBanks,p);
  this->m_numChips = 1;
  this->m_scaleModulators = false;
  this->m_runAtPcmRate = false;
  this->m_softPanning = false;
  this->m_masterVolume = '\x7f';
  this->m_musicMode = MODE_MIDI;
  this->m_volumeScale = VOLUME_Generic;
  this->m_channelAlloc = OPNMIDI_ChanAlloc_AUTO;
  this->m_lfoEnable = false;
  this->m_lfoFrequency = '\0';
  (this->m_insBankSetup).volumeModel = 0;
  (this->m_insBankSetup).lfoEnable = 0;
  (this->m_insBankSetup).lfoFrequency = 0;
  (this->m_insBankSetup).chipType = 0;
  (this->m_insBankSetup).mt32defaults = false;
  (this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  BasicBankMap<OPN2::Bank>::clear(&this->m_insBanks);
  return;
}

Assistant:

OPN2::OPN2() :
    m_regLFOSetup(0),
    m_numChips(1),
    m_scaleModulators(false),
    m_runAtPcmRate(false),
    m_softPanning(false),
    m_masterVolume(MasterVolumeDefault),
    m_musicMode(MODE_MIDI),
    m_volumeScale(VOLUME_Generic),
    m_channelAlloc(OPNMIDI_ChanAlloc_AUTO),
    m_lfoEnable(false),
    m_lfoFrequency(0),
    m_chipFamily(OPNChip_OPN2)
{
    m_insBankSetup.volumeModel = OPN2::VOLUME_Generic;
    m_insBankSetup.lfoEnable = false;
    m_insBankSetup.lfoFrequency = 0;
    m_insBankSetup.chipType = OPNChip_OPN2;
    m_insBankSetup.mt32defaults = false;

    // Initialize blank instruments banks
    m_insBanks.clear();
}